

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_fare_rules.c
# Opt level: O2

void CGTFS_RecordFareRule(void)

{
  int iVar1;
  int iVar2;
  fare_rule_t a;
  char *field_values [5];
  char *field_names [5];
  
  iVar1 = greatest_test_pre("fare_rule_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      iVar1 = -1;
      field_names[4] = "contains_id";
      field_names[2] = "origin_id";
      field_names[3] = "destination_id";
      field_names[0] = "fare_id";
      field_names[1] = "route_id";
      field_values[4] = "6";
      field_values[2] = "2";
      field_values[3] = "8";
      field_values[0] = "b";
      field_values[1] = "TSW";
      read_fare_rule(&a,5,field_names,field_values);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar2 = greatest_do_assert_equal_t("b",&a,&greatest_type_info_string,(void *)0x0);
      if (iVar2 == 0) {
        greatest_info.fail_line = 0x14;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_0011fed8:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"b\" != fr_1.fare_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = greatest_do_assert_equal_t("TSW",a.route_id,&greatest_type_info_string,(void *)0x0);
        if (iVar2 == 0) {
          greatest_info.fail_line = 0x15;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011fed8;
          greatest_info.msg = "\"TSW\" != fr_1.route_id";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar2 = greatest_do_assert_equal_t("2",a.origin_id,&greatest_type_info_string,(void *)0x0)
          ;
          if (iVar2 == 0) {
            greatest_info.fail_line = 0x16;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011fed8;
            greatest_info.msg = "\"2\" != fr_1.origin_id";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar2 = greatest_do_assert_equal_t
                              ("8",a.destination_id,&greatest_type_info_string,(void *)0x0);
            if (iVar2 == 0) {
              greatest_info.fail_line = 0x17;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011fed8;
              greatest_info.msg = "\"8\" != fr_1.destination_id";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar2 = greatest_do_assert_equal_t
                                ("6",a.contains_id,&greatest_type_info_string,(void *)0x0);
              if (iVar2 != 0) {
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_0011fef5;
              }
              greatest_info.fail_line = 0x18;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011fed8;
              greatest_info.msg = "\"6\" != fr_1.contains_id";
            }
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_rules.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00120055;
    }
LAB_0011fef5:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fare_rule_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&a,"SOME_ID1",0x140);
    memcpy((fare_rule_t *)field_names,"SOME_ID1",0x140);
    memcpy(field_values,"SOME_ID2",0x140);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_fare_rule(&a,(fare_rule_t *)field_names);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_fare_rule(&a,(fare_rule_t *)field_values);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_fare_rule((fare_rule_t *)field_names,(fare_rule_t *)field_values);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_0011fff4;
        }
        greatest_info.fail_line = 0x38;
        greatest_info.msg = "0 != equal_fare_rule(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x37;
        greatest_info.msg = "0 != equal_fare_rule(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x36;
      greatest_info.msg = "1 != equal_fare_rule(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_rules.c"
    ;
    if ((greatest_info.flags & 4) != 0) {
LAB_00120055:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_rules.c"
      ;
      abort();
    }
    iVar1 = -1;
  }
LAB_0011fff4:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordFareRule) {
    RUN_TEST(fare_rule_read);
    RUN_TEST(fare_rule_compare);
}